

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::BlenderModifier_Mirror::DoIt
          (BlenderModifier_Mirror *this,aiNode *out,ConversionData *conv_data,
          ElemBase *orig_modifier,Scene *param_4,Object *orig_object)

{
  TempArray<std::vector,_aiMesh> *this_00;
  pointer *pppaVar1;
  float *pfVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  _func_int **pp_Var7;
  aiVector3D *paVar8;
  uint *puVar9;
  iterator __position;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint *__dest;
  Logger *this_01;
  size_t sVar13;
  long lVar14;
  long lVar15;
  aiFace *paVar16;
  ulong uVar17;
  char *__s;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  uint uVar24;
  float fVar25;
  undefined1 auVar23 [16];
  float fVar26;
  float fVar27;
  aiMesh *mesh;
  long *local_1c8;
  long local_1b8 [2];
  aiMesh *local_1a8 [14];
  ios_base local_138 [264];
  
  if (*(int *)&orig_modifier[4]._vptr_ElemBase != 5) {
    __assert_fail("mir.modifier.type == ModifierData::eModifierType_Mirror",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderModifier.cpp"
                  ,0xa4,
                  "virtual void Assimp::Blender::BlenderModifier_Mirror::DoIt(aiNode &, ConversionData &, const ElemBase &, const Scene &, const Object &)"
                 );
  }
  this_00 = &conv_data->meshes;
  ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            (&this_00->arr,
             (ulong)out->mNumMeshes +
             ((long)(conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3));
  if (out->mNumMeshes == 0) {
    uVar21 = 0;
  }
  else {
    uVar17 = 0;
    do {
      SceneCombiner::Copy(local_1a8,
                          (this_00->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[out->mMeshes[uVar17]]);
      uVar6 = *(ushort *)((long)&orig_modifier[6].dna_type + 2);
      fVar20 = 1.0;
      if ((uVar6 & 0x20) != 0) {
        fVar20 = -1.0;
      }
      auVar23 = ZEXT616(CONCAT24(uVar6,(uint)uVar6)) & _DAT_006d20d0;
      uVar21 = -(uint)(auVar23._0_4_ == 0);
      uVar24 = -(uint)(auVar23._4_4_ == 0);
      fVar22 = (float)(uVar21 & 0x3f800000 | ~uVar21 & 0xbf800000);
      fVar25 = (float)(uVar24 & 0x3f800000 | ~uVar24 & 0xbf800000);
      pp_Var7 = orig_modifier[7]._vptr_ElemBase;
      if (pp_Var7 == (_func_int **)0x0) {
        if (local_1a8[0]->mNumVertices == 0) goto LAB_004f104d;
        lVar14 = 8;
        uVar18 = 0;
        do {
          paVar8 = local_1a8[0]->mVertices;
          uVar4 = *(undefined8 *)((long)paVar8 + lVar14 + -8);
          *(ulong *)((long)paVar8 + lVar14 + -8) =
               CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar25,(float)uVar4 * fVar22);
          *(float *)((long)&paVar8->x + lVar14) = *(float *)((long)&paVar8->x + lVar14) * fVar20;
          uVar18 = uVar18 + 1;
          uVar21 = local_1a8[0]->mNumVertices;
          lVar14 = lVar14 + 0xc;
        } while (uVar18 < uVar21);
      }
      else if (local_1a8[0]->mNumVertices == 0) {
LAB_004f104d:
        uVar21 = 0;
      }
      else {
        uVar4 = *(undefined8 *)((long)pp_Var7 + 0x45c);
        fVar3 = *(float *)((long)pp_Var7 + 0x464);
        lVar14 = 8;
        uVar18 = 0;
        do {
          paVar8 = local_1a8[0]->mVertices;
          uVar5 = *(undefined8 *)((long)paVar8 + lVar14 + -8);
          fVar26 = (float)uVar4;
          fVar27 = (float)((ulong)uVar4 >> 0x20);
          pfVar2 = (float *)((long)paVar8 + lVar14 + -8);
          *pfVar2 = (fVar26 - (float)uVar5) * fVar22 + fVar26;
          pfVar2[1] = (fVar27 - (float)((ulong)uVar5 >> 0x20)) * fVar25 + fVar27;
          *(float *)((long)&paVar8->x + lVar14) =
               (fVar3 - *(float *)((long)&paVar8->x + lVar14)) * fVar20 + fVar3;
          uVar18 = uVar18 + 1;
          uVar21 = local_1a8[0]->mNumVertices;
          lVar14 = lVar14 + 0xc;
        } while (uVar18 < uVar21);
      }
      if (uVar21 != 0 && local_1a8[0]->mNormals != (aiVector3D *)0x0) {
        lVar14 = 8;
        uVar18 = 0;
        do {
          paVar8 = local_1a8[0]->mNormals;
          uVar4 = *(undefined8 *)((long)paVar8 + lVar14 + -8);
          *(ulong *)((long)paVar8 + lVar14 + -8) =
               CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar25,(float)uVar4 * fVar22);
          *(float *)((long)&paVar8->x + lVar14) = *(float *)((long)&paVar8->x + lVar14) * fVar20;
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0xc;
        } while (uVar18 < local_1a8[0]->mNumVertices);
      }
      if ((local_1a8[0]->mTangents != (aiVector3D *)0x0) && (local_1a8[0]->mNumVertices != 0)) {
        lVar14 = 8;
        uVar18 = 0;
        do {
          paVar8 = local_1a8[0]->mTangents;
          uVar4 = *(undefined8 *)((long)paVar8 + lVar14 + -8);
          *(ulong *)((long)paVar8 + lVar14 + -8) =
               CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar25,(float)uVar4 * fVar22);
          *(float *)((long)&paVar8->x + lVar14) = *(float *)((long)&paVar8->x + lVar14) * fVar20;
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0xc;
        } while (uVar18 < local_1a8[0]->mNumVertices);
      }
      if ((local_1a8[0]->mBitangents != (aiVector3D *)0x0) && (local_1a8[0]->mNumVertices != 0)) {
        lVar14 = 8;
        uVar18 = 0;
        do {
          paVar8 = local_1a8[0]->mBitangents;
          uVar4 = *(undefined8 *)((long)paVar8 + lVar14 + -8);
          *(ulong *)((long)paVar8 + lVar14 + -8) =
               CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar25,(float)uVar4 * fVar22);
          *(float *)((long)&paVar8->x + lVar14) = *(float *)((long)&paVar8->x + lVar14) * fVar20;
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + 0xc;
        } while (uVar18 < local_1a8[0]->mNumVertices);
      }
      uVar6 = *(ushort *)((long)&orig_modifier[6].dna_type + 2);
      auVar23 = ZEXT616(CONCAT24(uVar6,(uint)uVar6)) & _DAT_006d20e0;
      uVar21 = -(uint)(auVar23._0_4_ == 0);
      uVar24 = -(uint)(auVar23._4_4_ == 0);
      lVar14 = 0;
      do {
        if ((local_1a8[0]->mTextureCoords[lVar14] == (aiVector3D *)0x0) ||
           (local_1a8[0]->mNumVertices == 0)) break;
        lVar15 = 0;
        uVar18 = 0;
        do {
          puVar9 = (uint *)((long)&local_1a8[0]->mTextureCoords[lVar14]->x + lVar15);
          uVar10 = *puVar9;
          uVar11 = puVar9[1];
          puVar9 = (uint *)((long)&local_1a8[0]->mTextureCoords[lVar14]->x + lVar15);
          *puVar9 = ~uVar21 & (uVar10 ^ 0x80000000) | uVar10 & uVar21;
          puVar9[1] = ~uVar24 & (uVar11 ^ 0x80000000) | uVar11 & uVar24;
          uVar18 = uVar18 + 1;
          lVar15 = lVar15 + 0xc;
        } while (uVar18 < local_1a8[0]->mNumVertices);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 8);
      if ((fVar20 * fVar25 * fVar22 < 0.0) && (local_1a8[0]->mNumFaces != 0)) {
        uVar18 = 0;
        do {
          uVar21 = local_1a8[0]->mFaces[uVar18].mNumIndices;
          if (1 < uVar21) {
            paVar16 = local_1a8[0]->mFaces + uVar18;
            iVar12 = -1;
            uVar19 = 0;
            do {
              puVar9 = paVar16->mIndices;
              uVar24 = puVar9[uVar19];
              puVar9[uVar19] = puVar9[uVar21 + iVar12];
              puVar9[uVar21 + iVar12] = uVar24;
              uVar19 = uVar19 + 1;
              uVar21 = paVar16->mNumIndices;
              iVar12 = iVar12 + -1;
            } while (uVar19 < uVar21 >> 1);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_1a8[0]->mNumFaces);
      }
      __position._M_current =
           (conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                  ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,__position,local_1a8);
      }
      else {
        *__position._M_current = local_1a8[0];
        pppaVar1 = &(conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      uVar17 = uVar17 + 1;
      uVar21 = out->mNumMeshes;
    } while (uVar17 < uVar21);
  }
  uVar24 = uVar21 * 2;
  __dest = (uint *)operator_new__((ulong)uVar24 * 4);
  puVar9 = out->mMeshes;
  if (uVar21 != 0) {
    sVar13 = (ulong)uVar21 * 4;
    memmove(__dest,puVar9,sVar13);
    lVar14 = 0;
    do {
      *(uint *)((long)__dest + lVar14 + (ulong)uVar21 * 4) =
           *(int *)((long)puVar9 + lVar14) + uVar21;
      lVar14 = lVar14 + 4;
    } while (sVar13 - lVar14 != 0);
  }
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
    uVar24 = out->mNumMeshes * 2;
  }
  out->mMeshes = __dest;
  out->mNumMeshes = uVar24;
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[50]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [50])"BlendModifier: Applied the `Mirror` modifier to `");
  __s = (orig_object->id).name;
  sVar13 = strlen(__s);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar13);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"`",1);
  ::std::__cxx11::stringbuf::str();
  Logger::info(this_01,(char *)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void  BlenderModifier_Mirror :: DoIt(aiNode& out, ConversionData& conv_data,  const ElemBase& orig_modifier,
    const Scene& /*in*/,
    const Object& orig_object )
{
    // hijacking the ABI, see the big note in BlenderModifierShowcase::ApplyModifiers()
    const MirrorModifierData& mir = static_cast<const MirrorModifierData&>(orig_modifier);
    ai_assert(mir.modifier.type == ModifierData::eModifierType_Mirror);

    conv_data.meshes->reserve(conv_data.meshes->size() + out.mNumMeshes);

    // XXX not entirely correct, mirroring on two axes results in 4 distinct objects in blender ...

    // take all input meshes and clone them
    for (unsigned int i = 0; i < out.mNumMeshes; ++i) {
        aiMesh* mesh;
        SceneCombiner::Copy(&mesh,conv_data.meshes[out.mMeshes[i]]);

        const float xs = mir.flag & MirrorModifierData::Flags_AXIS_X ? -1.f : 1.f;
        const float ys = mir.flag & MirrorModifierData::Flags_AXIS_Y ? -1.f : 1.f;
        const float zs = mir.flag & MirrorModifierData::Flags_AXIS_Z ? -1.f : 1.f;

        if (mir.mirror_ob) {
            const aiVector3D center( mir.mirror_ob->obmat[3][0],mir.mirror_ob->obmat[3][1],mir.mirror_ob->obmat[3][2] );
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];

                v.x = center.x + xs*(center.x - v.x);
                v.y = center.y + ys*(center.y - v.y);
                v.z = center.z + zs*(center.z - v.z);
            }
        }
        else {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mNormals) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mNormals[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mTangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mBitangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mBitangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        const float us = mir.flag & MirrorModifierData::Flags_MIRROR_U ? -1.f : 1.f;
        const float vs = mir.flag & MirrorModifierData::Flags_MIRROR_V ? -1.f : 1.f;

        for (unsigned int n = 0; mesh->HasTextureCoords(n); ++n) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTextureCoords[n][i];
                v.x *= us;v.y *= vs;
            }
        }

        // Only reverse the winding order if an odd number of axes were mirrored.
        if (xs * ys * zs < 0) {
            for( unsigned int i = 0; i < mesh->mNumFaces; i++) {
                aiFace& face = mesh->mFaces[i];
                for( unsigned int fi = 0; fi < face.mNumIndices / 2; ++fi)
                    std::swap( face.mIndices[fi], face.mIndices[face.mNumIndices - 1 - fi]);
            }
        }

        conv_data.meshes->push_back(mesh);
    }
    unsigned int* nind = new unsigned int[out.mNumMeshes*2];

    std::copy(out.mMeshes,out.mMeshes+out.mNumMeshes,nind);
    std::transform(out.mMeshes,out.mMeshes+out.mNumMeshes,nind+out.mNumMeshes,
        [&out](unsigned int n) { return out.mNumMeshes + n; });

    delete[] out.mMeshes;
    out.mMeshes = nind;
    out.mNumMeshes *= 2;

    ASSIMP_LOG_INFO_F("BlendModifier: Applied the `Mirror` modifier to `",
        orig_object.id.name,"`");
}